

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::update_connections_limit(session_impl *this)

{
  mutex *pmVar1;
  pointer psVar2;
  element_type *peVar3;
  torrent *this_00;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  shared_ptr<libtorrent::aux::torrent> *t;
  pointer psVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  pointer psVar17;
  uint uVar18;
  int local_44;
  undefined1 local_40 [16];
  
  pmVar1 = &(this->m_settings).m_mutex;
  local_40._9_7_ = SUB87(local_40._0_8_,1);
  local_40[8] = 0;
  local_40._0_8_ = pmVar1;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
  local_40[8] = true;
  iVar5 = (this->m_settings).m_store.m_ints._M_elems[0x55];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  if (iVar5 < 1) {
    iVar5 = max_open_files();
  }
  local_40[8] = 0;
  local_40._0_8_ = pmVar1;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
  local_40[8] = true;
  (this->m_settings).m_store.m_ints._M_elems[0x55] = iVar5;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  sVar4 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_40[8] = 0;
  local_40._0_8_ = pmVar1;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
  local_40[8] = true;
  iVar5 = (this->m_settings).m_store.m_ints._M_elems[0x55];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  if ((iVar5 < (int)sVar4) &&
     ((this->m_torrents).m_array.
      super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_torrents).m_array.
      super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    sVar4 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_40[8] = 0;
    local_40._0_8_ = pmVar1;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
    local_40[8] = true;
    local_44 = (int)sVar4 - (this->m_settings).m_store.m_ints._M_elems[0x55];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    local_40[8] = 0;
    local_40._0_8_ = pmVar1;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
    local_40[8] = true;
    iVar5 = (this->m_settings).m_store.m_ints._M_elems[0x55];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    uVar13 = (long)iVar5 /
             (long)(int)((ulong)((long)(this->m_torrents).m_array.
                                       super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_torrents).m_array.
                                      super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) & 0xffffffff;
    local_40[8] = 0;
    local_40._0_8_ = pmVar1;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
    local_40[8] = true;
    iVar5 = (this->m_settings).m_store.m_ints._M_elems[0x55];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    psVar17 = (this->m_torrents).m_array.
              super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar10 = (long)iVar5 % (long)(int)((ulong)((long)psVar2 - (long)psVar17) >> 4) & 0xffffffff;
    iVar14 = 0;
    iVar5 = 0;
    do {
      iVar15 = 0;
      iVar12 = (int)uVar13;
      uVar11 = uVar10;
      for (psVar7 = psVar17; iVar9 = (int)uVar11, psVar7 != psVar2; psVar7 = psVar7 + 1) {
        peVar3 = (psVar7->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        iVar8 = (int)((ulong)((long)*(pointer *)
                                     ((long)&(peVar3->super_torrent_hot_members).m_connections.
                                             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                             .
                                             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                             ._M_impl + 8) -
                             (long)(peVar3->super_torrent_hot_members).m_connections.
                                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                   .
                                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                (int)((ulong)((long)(peVar3->m_peers_to_disconnect).
                                    super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(peVar3->m_peers_to_disconnect).
                                   super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
        if (iVar5 < iVar8) {
          iVar16 = iVar12 - iVar8;
          if (iVar12 - iVar8 == 0 || iVar12 < iVar8) {
            iVar16 = 0;
          }
          iVar15 = iVar15 + (uint)(iVar12 < iVar8);
          uVar11 = (ulong)(uint)(iVar9 + iVar16);
        }
      }
      iVar15 = iVar15 + (uint)(iVar15 == 0);
      uVar18 = iVar9 / iVar15 + iVar12;
      uVar10 = (long)iVar9 % (long)iVar15 & 0xffffffff;
      if (iVar9 == 0) break;
      iVar14 = iVar14 + 1;
      uVar13 = (ulong)uVar18;
      uVar11 = uVar10;
      iVar5 = iVar12;
    } while (iVar14 != 4);
    for (; psVar17 != psVar2; psVar17 = psVar17 + 1) {
      this_00 = (psVar17->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      iVar5 = (int)((ulong)((long)(this_00->super_torrent_hot_members).m_connections.
                                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                  .
                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->super_torrent_hot_members).m_connections.
                                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 .
                                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) -
              (int)((ulong)((long)(this_00->m_peers_to_disconnect).
                                  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->m_peers_to_disconnect).
                                 super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      if ((int)uVar18 < iVar5) {
        local_40 = (undefined1  [16])errors::make_error_code(too_many_connections);
        uVar6 = (uint)(0 < (int)uVar11);
        iVar5 = (iVar5 - uVar6) - uVar18;
        if (local_44 <= iVar5) {
          iVar5 = local_44;
        }
        local_44 = local_44 - iVar5;
        uVar11 = (ulong)((int)uVar11 - uVar6);
        torrent::disconnect_peers(this_00,iVar5,(error_code *)local_40);
      }
    }
  }
  return;
}

Assistant:

void session_impl::update_connections_limit()
	{
		int limit = m_settings.get_int(settings_pack::connections_limit);

		if (limit <= 0) limit = max_open_files();

		m_settings.set_int(settings_pack::connections_limit, limit);

		if (num_connections() > m_settings.get_int(settings_pack::connections_limit)
			&& !m_torrents.empty())
		{
			// if we have more connections that we're allowed, disconnect
			// peers from the torrents so that they are all as even as possible

			int to_disconnect = num_connections() - m_settings.get_int(settings_pack::connections_limit);

			int last_average = 0;
			int average = m_settings.get_int(settings_pack::connections_limit) / int(m_torrents.size());

			// the number of slots that are unused by torrents
			int extra = m_settings.get_int(settings_pack::connections_limit) % int(m_torrents.size());

			// run 3 iterations of this, then we're probably close enough
			for (int iter = 0; iter < 4; ++iter)
			{
				// the number of torrents that are above average
				int num_above = 0;
				for (auto const& t : m_torrents)
				{
					int const num = t->num_peers();
					if (num <= last_average) continue;
					if (num > average) ++num_above;
					if (num < average) extra += average - num;
				}

				// distribute extra among the torrents that are above average
				if (num_above == 0) num_above = 1;
				last_average = average;
				average += extra / num_above;
				if (extra == 0) break;
				// save the remainder for the next iteration
				extra = extra % num_above;
			}

			for (auto const& t : m_torrents)
			{
				int const num = t->num_peers();
				if (num <= average) continue;

				// distribute the remainder
				int my_average = average;
				if (extra > 0)
				{
					++my_average;
					--extra;
				}

				int const disconnect = std::min(to_disconnect, num - my_average);
				to_disconnect -= disconnect;
				t->disconnect_peers(disconnect, errors::too_many_connections);
			}
		}
	}